

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,UnaryExpression *unary_exp,void *data)

{
  SyntaxTree *pSVar1;
  int iVar2;
  SemanticException *this_00;
  undefined4 uVar3;
  ExpVarData exp_var_data;
  
  exp_var_data.semantic_op_ = SemanticOp_Read;
  exp_var_data.exp_type_ = ExpType_Unknown;
  exp_var_data.results_any_count_ = false;
  pSVar1 = (unary_exp->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&exp_var_data);
  if (exp_var_data.exp_type_ == ExpType_Unknown) {
    iVar2 = (unary_exp->op_token_).token_;
LAB_00162cc0:
    uVar3 = 3;
    if ((iVar2 != 0x23) && (iVar2 != 0x2d)) {
      if (iVar2 != 0x10d) {
        __assert_fail("!\"unexpect unary operator\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                      ,0x247,
                      "virtual void luna::SemanticAnalysisVisitor::Visit(UnaryExpression *, void *)"
                     );
      }
      uVar3 = 2;
    }
  }
  else {
    iVar2 = (unary_exp->op_token_).token_;
    if (iVar2 == 0x23) {
      if ((exp_var_data.exp_type_ & ~ExpType_Bool) != ExpType_String) {
        this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
        SemanticException::SemanticException
                  (this_00,"operand is not table or string",&unary_exp->op_token_);
LAB_00162d0d:
        __cxa_throw(this_00,&SemanticException::typeinfo,Exception::~Exception);
      }
    }
    else {
      if (iVar2 != 0x2d) goto LAB_00162cc0;
      if (exp_var_data.exp_type_ != ExpType_Number) {
        this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
        SemanticException::SemanticException(this_00,"operand is not number",&unary_exp->op_token_);
        goto LAB_00162d0d;
      }
    }
    uVar3 = 3;
  }
  *(undefined4 *)((long)data + 4) = uVar3;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(UnaryExpression *unary_exp, void *data)
    {
        // Unary expression is read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        unary_exp->exp_->Accept(this, &exp_var_data);

        // Expression type
        if (exp_var_data.exp_type_ != ExpType_Unknown)
        {
            switch (unary_exp->op_token_.token_)
            {
                case '-':
                    if (exp_var_data.exp_type_ != ExpType_Number)
                        throw SemanticException("operand is not number",
                                                unary_exp->op_token_);
                    break;
                case '#':
                    if (exp_var_data.exp_type_ != ExpType_Table &&
                        exp_var_data.exp_type_ != ExpType_String)
                        throw SemanticException("operand is not table or string",
                                                unary_exp->op_token_);
                    break;
                default:
                    break;
            }
        }

        auto parent_exp_var_data = static_cast<ExpVarData *>(data);
        if (unary_exp->op_token_.token_ == '-' ||
            unary_exp->op_token_.token_ == '#')
            parent_exp_var_data->exp_type_ = ExpType_Number;
        else if (unary_exp->op_token_.token_ == Token_Not)
            parent_exp_var_data->exp_type_ = ExpType_Bool;
        else
            assert(!"unexpect unary operator");
    }